

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmCTest *this_00;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  pointer pbVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  ostringstream cmCTestLog_msg;
  RegularExpression pfW;
  ostringstream ostr;
  char *local_448;
  long local_440;
  char local_438;
  undefined7 uStack_437;
  ulong local_428;
  string *local_420;
  vector<int,_std::allocator<int>_> *local_418;
  pointer local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  undefined1 local_3f0 [112];
  ios_base local_380 [264];
  RegularExpression local_278;
  undefined1 local_1a8 [376];
  
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418 = results;
  cmsys::SystemTools::Split(str,&local_408);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar12 = 0;
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  local_278.regmust = (char *)0x0;
  local_278.program = (char *)0x0;
  local_278.progsize = 0;
  local_420 = log;
  memset(&local_278,0,0xaa);
  cmsys::RegularExpression::compile(&local_278,"^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");
  local_410 = local_408.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar12 = 0;
    pbVar7 = local_408.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar2 = (this->ResultStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = (this->ResultStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = cmsys::RegularExpression::find
                        (&local_278,(pbVar7->_M_dataplus)._M_p,&local_278.regmatch);
      uVar10 = (long)pbVar2 - (long)pbVar3 >> 5;
      uVar11 = uVar10;
      if (bVar4) {
        if ((this->ResultStrings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->ResultStrings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar9 = 0;
        }
        else {
          lVar8 = 8;
          uVar9 = 0;
          local_428 = uVar12;
          do {
            if (local_278.regmatch.startp[1] == (char *)0x0) {
              local_3f0._0_8_ = local_3f0 + 0x10;
              local_3f0._8_8_ = 0;
              local_3f0[0x10] = 0;
            }
            else {
              local_3f0._0_8_ = local_3f0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3f0,local_278.regmatch.startp[1],local_278.regmatch.endp[1]
                        );
            }
            pbVar2 = (this->ResultStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_3f0._8_8_ == *(size_t *)((long)&(pbVar2->_M_dataplus)._M_p + lVar8)) {
              if (local_3f0._8_8_ == 0) {
                bVar4 = true;
              }
              else {
                iVar5 = bcmp((void *)local_3f0._0_8_,*(void **)((long)pbVar2 + lVar8 + -8),
                             local_3f0._8_8_);
                bVar4 = iVar5 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
              operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1
                             );
            }
            uVar11 = uVar9;
            uVar12 = local_428;
            if (bVar4) break;
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 0x20;
            uVar11 = uVar10;
          } while (uVar9 < (ulong)((long)(this->ResultStrings).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->ResultStrings).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if (uVar9 == (long)(this->ResultStrings).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->ResultStrings).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Unknown Purify memory fault: ",0x1d);
          local_448 = &local_438;
          if (local_278.regmatch.startp[1] == (char *)0x0) {
            local_440 = 0;
            local_438 = '\0';
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_448,local_278.regmatch.startp[1],local_278.regmatch.endp[1])
            ;
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3f0,local_448,local_440);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if (local_448 != &local_438) {
            operator_delete(local_448,CONCAT71(uStack_437,local_438) + 1);
          }
          this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(this_00,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x38a,local_448,false);
          if (local_448 != &local_438) {
            operator_delete(local_448,CONCAT71(uStack_437,local_438) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"*** Unknown Purify memory fault: ",0x21);
          if (local_278.regmatch.startp[1] == (char *)0x0) {
            local_3f0._0_8_ = local_3f0 + 0x10;
            local_3f0._8_8_ = 0;
            local_3f0[0x10] = 0;
          }
          else {
            local_3f0._0_8_ = local_3f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f0,local_278.regmatch.startp[1],local_278.regmatch.endp[1]);
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3f0._0_8_,local_3f0._8_8_);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
          }
        }
      }
      if (uVar11 != (long)(this->ResultStrings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->ResultStrings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<b>",3);
        pbVar2 = (this->ResultStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar2[uVar11]._M_dataplus._M_p,
                            pbVar2[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</b> ",5);
        piVar1 = (local_418->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar11;
        *piVar1 = *piVar1 + 1;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_410);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_420,(string *)local_3f0);
  if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
  }
  this->DefectCount = this->DefectCount + (int)uVar12;
  if (local_278.program != (char *)0x0) {
    operator_delete__(local_278.program);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408);
  return (int)uVar12 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();

  cmsys::RegularExpression pfW("^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");

  int defects = 0;

  for (std::string const& l : lines) {
    std::vector<int>::size_type failure = this->ResultStrings.size();
    if (pfW.find(l)) {
      std::vector<int>::size_type cc;
      for (cc = 0; cc < this->ResultStrings.size(); cc++) {
        if (pfW.match(1) == this->ResultStrings[cc]) {
          failure = cc;
          break;
        }
      }
      if (cc == this->ResultStrings.size()) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unknown Purify memory fault: " << pfW.match(1)
                                                   << std::endl);
        ostr << "*** Unknown Purify memory fault: " << pfW.match(1)
             << std::endl;
      }
    }
    if (failure != this->ResultStrings.size()) {
      ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
      results[failure]++;
      defects++;
    }
    ostr << l << std::endl;
  }

  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}